

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hbtrie.cc
# Opt level: O1

hbtrie_result hbtrie_iterator_free(hbtrie_iterator *it)

{
  btree_iterator *it_00;
  list_elem *e;
  
  e = (it->btreeit_list).head;
  if (e != (list_elem *)0x0) {
    do {
      it_00 = (btree_iterator *)(e + -7);
      e = list_remove(&it->btreeit_list,e);
      btree_iterator_free(it_00);
      free(it_00);
    } while (e != (list_elem *)0x0);
  }
  free((it->trie).last_map_chunk);
  if (it->curkey != (void *)0x0) {
    free(it->curkey);
  }
  return HBTRIE_RESULT_SUCCESS;
}

Assistant:

hbtrie_result hbtrie_iterator_free(struct hbtrie_iterator *it)
{
    struct list_elem *e;
    struct btreeit_item *item;
    e = list_begin(&it->btreeit_list);
    while(e){
        item = _get_entry(e, struct btreeit_item, le);
        e = list_remove(&it->btreeit_list, e);
        btree_iterator_free(&item->btree_it);
        mempool_free(item);
    }
    free(it->trie.last_map_chunk);
    if (it->curkey) free(it->curkey);
    return HBTRIE_RESULT_SUCCESS;
}